

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineComputer.cxx
# Opt level: O3

string * __thiscall
cmLinkLineComputer::ConvertToLinkReference
          (string *__return_storage_ptr__,cmLinkLineComputer *this,string *lib)

{
  pointer pcVar1;
  bool bVar2;
  string *psVar3;
  cmStateDirectory *this_00;
  string local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (lib->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + lib->_M_string_length);
  this_00 = &this->StateDir;
  psVar3 = cmStateDirectory::GetCurrentBinary_abi_cxx11_(this_00);
  bVar2 = cmStateDirectory::ContainsBoth(this_00,psVar3,lib);
  if (bVar2) {
    psVar3 = cmStateDirectory::GetCurrentBinary_abi_cxx11_(this_00);
    cmSystemTools::ForceToRelativePath(&local_40,psVar3,lib);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLinkLineComputer::ConvertToLinkReference(
  std::string const& lib) const
{
  std::string relLib = lib;

  if (this->StateDir.ContainsBoth(this->StateDir.GetCurrentBinary(), lib)) {
    relLib = cmSystemTools::ForceToRelativePath(
      this->StateDir.GetCurrentBinary(), lib);
  }
  return relLib;
}